

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-cluster.c
# Opt level: O0

int lunpackrequest(lua_State *L)

{
  int iVar1;
  uint8_t *buf;
  int sz;
  char *msg;
  size_t ssz;
  lua_State *L_local;
  
  ssz = (size_t)L;
  buf = (uint8_t *)luaL_checklstring(L,1,(size_t *)&msg);
  iVar1 = (int)(char)*buf;
  if (iVar1 == -0x80) {
    L_local._4_4_ = unpackreq_string((lua_State *)ssz,buf,(int)msg);
  }
  else if (iVar1 == -0x7f) {
    L_local._4_4_ = unpackmreq_string((lua_State *)ssz,buf,(int)msg);
  }
  else if (iVar1 == 0) {
    L_local._4_4_ = unpackreq_number((lua_State *)ssz,buf,(int)msg);
  }
  else if (iVar1 == 1) {
    L_local._4_4_ = unpackmreq_number((lua_State *)ssz,buf,(int)msg);
  }
  else if (iVar1 - 2U < 2) {
    L_local._4_4_ = unpackmreq_part((lua_State *)ssz,buf,(int)msg);
  }
  else {
    L_local._4_4_ =
         luaL_error((lua_State *)ssz,"Invalid req package type %d",(ulong)(uint)(int)(char)*buf);
  }
  return L_local._4_4_;
}

Assistant:

static int
lunpackrequest(lua_State *L) {
	size_t ssz;
	const char *msg = luaL_checklstring(L,1,&ssz);
	int sz = (int)ssz;
	switch (msg[0]) {
	case 0:
		return unpackreq_number(L, (const uint8_t *)msg, sz);
	case 1:
		return unpackmreq_number(L, (const uint8_t *)msg, sz);
	case 2:
	case 3:
		return unpackmreq_part(L, (const uint8_t *)msg, sz);
	case '\x80':
		return unpackreq_string(L, (const uint8_t *)msg, sz);
	case '\x81':
		return unpackmreq_string(L, (const uint8_t *)msg, sz);
	default:
		return luaL_error(L, "Invalid req package type %d", msg[0]);
	}
}